

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O3

ExecutionResult * __thiscall
SchemeCompoundProcedure::_run
          (ExecutionResult *__return_storage_ptr__,SchemeCompoundProcedure *this,
          list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
          *val_list)

{
  unique_ptr<TailContext,_std::default_delete<TailContext>_> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  _Head_base<0UL,_TailContext_*,_false> __ptr;
  undefined8 uVar1;
  undefined8 uVar2;
  _Head_base<0UL,_TailContext_*,_false> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  _List_node_base *p_Var8;
  ulong uVar9;
  _List_node_base *p_Var10;
  const_reverse_iterator rlit;
  Context local_context;
  undefined1 local_99;
  undefined1 local_98 [24];
  _Head_base<0UL,_TailContext_*,_false> local_80;
  SchemePair *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_70 [2];
  Context local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  std::__cxx11::
  list<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
  ::list(&local_60.locals,&(this->context).locals);
  local_60.toplevel = (this->context).toplevel;
  Context::new_frame(&local_60);
  lVar5 = (this->super_SchemeProcedure).arity.second;
  p_Var8 = (this->params).
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  p_Var10 = (val_list->
            super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
            )._M_impl._M_node.super__List_node_base._M_next;
  uVar9 = (val_list->
          super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
          )._M_impl._M_node._M_size;
  uVar6 = (lVar5 >> 0x3f) +
          (this->params).
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node._M_size;
  if (uVar9 <= uVar6) {
    uVar6 = uVar9;
  }
  if (uVar6 != 0) {
    uVar9 = 0;
    do {
      Context::set(&local_60,(string *)(p_Var8 + 1),(shared_ptr<SchemeObject> *)(p_Var10 + 1));
      uVar9 = uVar9 + 1;
      p_Var8 = p_Var8->_M_next;
      p_Var10 = (((_List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                   *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      uVar6 = (val_list->
              super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
              )._M_impl._M_node._M_size;
      lVar5 = (this->super_SchemeProcedure).arity.second;
      uVar7 = (lVar5 >> 0x3f) +
              (this->params).
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size;
      if (uVar6 <= uVar7) {
        uVar7 = uVar6;
      }
    } while (uVar9 < uVar7);
  }
  if (p_Var10 == (_List_node_base *)val_list) {
    if (p_Var8 != (_List_node_base *)&this->params) {
      do {
        Context::set(&local_60,(string *)(p_Var8 + 1),&scheme_empty);
        p_Var8 = p_Var8->_M_next;
      } while (p_Var8 != (_List_node_base *)&this->params);
      lVar5 = (this->super_SchemeProcedure).arity.second;
    }
    if (lVar5 < 0) {
      Context::set(&local_60,
                   (string *)
                   ((this->params).
                    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl._M_node.super__List_node_base._M_prev + 1),&scheme_nil);
    }
  }
  else {
    local_98._0_8_ = scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_98._8_8_ =
         scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count =
             (scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    do {
      local_78 = (SchemePair *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<SchemePair,std::allocator<SchemePair>,std::shared_ptr<SchemeObject>const&,std::shared_ptr<SchemeObject>&>
                (a_Stack_70,&local_78,(allocator<SchemePair> *)&local_99,
                 (shared_ptr<SchemeObject> *)
                 ((val_list->
                  super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  )._M_impl._M_node.super__List_node_base._M_prev + 1),
                 (shared_ptr<SchemeObject> *)local_98);
      _Var4._M_pi = a_Stack_70[0]._M_pi;
      local_98._0_8_ = local_78;
      uVar1 = local_98._8_8_;
      local_78 = (SchemePair *)0x0;
      a_Stack_70[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98._8_8_ = _Var4._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1 !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar1);
        if (a_Stack_70[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_70[0]._M_pi);
        }
      }
      val_list = (list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  *)(val_list->
                    super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                    )._M_impl._M_node.super__List_node_base._M_prev;
    } while ((_List_node_base *)val_list != p_Var10);
    Context::set(&local_60,
                 (string *)
                 ((this->params).
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_prev + 1),
                 (shared_ptr<SchemeObject> *)local_98);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
  }
  __return_storage_ptr__->type = VALUE;
  (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->tail_context)._M_t.
  super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
  super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
  super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = (TailContext *)0x0;
  p_Var10 = (this->body).super__List_base<ASTNode,_std::allocator<ASTNode>_>._M_impl._M_node.
            super__List_node_base._M_next;
  if (p_Var10 != (_List_node_base *)&this->body) {
    this_00 = &__return_storage_ptr__->tail_context;
    do {
      ExecutionResult::force_value((ExecutionResult *)&stack0xffffffffffffffc0);
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      ASTNode::evaluate((ExecutionResult *)local_98,(ASTNode *)(p_Var10 + 1),&local_60);
      uVar2 = local_98._16_8_;
      uVar1 = local_98._8_8_;
      __return_storage_ptr__->type = local_98._0_4_;
      local_98._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_98._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      this_01 = (__return_storage_ptr__->value).
                super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)uVar1;
      (__return_storage_ptr__->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      _Var3._M_head_impl = local_80._M_head_impl;
      local_80._M_head_impl = (TailContext *)0x0;
      __ptr._M_head_impl =
           (this_00->_M_t).super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>.
           _M_t.super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
           super__Head_base<0UL,_TailContext_*,_false>._M_head_impl;
      (this_00->_M_t).super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
      super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
      super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = _Var3._M_head_impl;
      if (__ptr._M_head_impl != (TailContext *)0x0) {
        std::default_delete<TailContext>::operator()
                  ((default_delete<TailContext> *)this_00,__ptr._M_head_impl);
        if ((_Head_base<0UL,_TailContext_*,_false>)local_80._M_head_impl !=
            (_Head_base<0UL,_TailContext_*,_false>)0x0) {
          std::default_delete<TailContext>::operator()
                    ((default_delete<TailContext> *)&local_80,local_80._M_head_impl);
        }
      }
      local_80._M_head_impl = (TailContext *)0x0;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._16_8_);
      }
      p_Var10 = p_Var10->_M_next;
    } while (p_Var10 != (_List_node_base *)&this->body);
  }
  std::__cxx11::
  _List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
  ::_M_clear((_List_base<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>,_std::allocator<std::shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<SchemeObject>_>_>_>_>_>_>
              *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

ExecutionResult SchemeCompoundProcedure::_run(const std::list<std::shared_ptr<SchemeObject>> &val_list) const
{
    Context local_context = context;
    local_context.new_frame();
    auto pit = params.begin();
    auto lit = val_list.begin();

    for(size_t i=0; i < std::min(val_list.size(), params.size() - (arity.second < 0)); ++lit, ++pit, ++i)
    {
        local_context.set(*pit, *lit);
    }
    if(lit == val_list.end())
    {
        for(;pit!=params.end(); ++pit)
        {
            local_context.set(*pit, scheme_empty);
        }
        if(arity.second < 0)
            local_context.set(params.back(), scheme_nil);
    }
    else
    {
        auto rem = scheme_nil;
        for(auto rlit = val_list.rbegin(); rlit.base() != lit; ++rlit)
            rem = std::make_shared<SchemePair>(*rlit, rem);
        local_context.set(params.back(), rem);
    }

    ExecutionResult res;
    for(auto i = body.begin(); i != body.end(); ++i)
    {
        res.force_value();
        res = i->evaluate(local_context);
    }
    return res;
}